

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::Orthogonalize(ON_Xform *this,double tol)

{
  bool bVar1;
  double d;
  ON_3dVector local_270;
  int local_258;
  int local_254;
  int j;
  int i;
  double local_248;
  double local_240;
  ON_3dVector local_238;
  ON_3dVector local_220;
  double local_208;
  ON_3dVector V [3];
  ON_Xform local_1b8;
  undefined1 local_138 [8];
  ON_Xform LTL;
  ON_Xform L;
  ON_3dVector T;
  bool rc;
  double tol_local;
  ON_Xform *this_local;
  
  T.z._7_1_ = false;
  bVar1 = IsAffine(this);
  if (bVar1) {
    ON_Xform((ON_Xform *)(LTL.m_xform[3] + 3));
    DecomposeAffine(this,(ON_3dVector *)(L.m_xform[3] + 3),(ON_Xform *)(LTL.m_xform[3] + 3));
    memcpy(local_138,LTL.m_xform[3] + 3,0x80);
    Transpose((ON_Xform *)local_138);
    operator*(&local_1b8,(ON_Xform *)local_138,(ON_Xform *)(LTL.m_xform[3] + 3));
    memcpy(local_138,&local_1b8,0x80);
    bVar1 = IsIdentity((ON_Xform *)local_138,tol);
    if (bVar1) {
      T.z._7_1_ = true;
    }
    else {
      ON_3dVector::ON_3dVector(&local_220,(double *)this);
      local_208 = local_220.x;
      V[0].x = local_220.y;
      V[0].y = local_220.z;
      ON_3dVector::ON_3dVector(&local_238,this->m_xform[1]);
      V[0].z = local_238.x;
      V[1].x = local_238.y;
      V[1].y = local_238.z;
      ON_3dVector::ON_3dVector((ON_3dVector *)&j,this->m_xform[2]);
      V[1].z = _j;
      V[2].x = local_248;
      V[2].y = local_240;
      T.z._7_1_ = true;
      for (local_254 = 0; T.z._7_1_ != false && local_254 < 3; local_254 = local_254 + 1) {
        for (local_258 = 0; local_258 < local_254; local_258 = local_258 + 1) {
          d = ON_3dVector::operator*
                        ((ON_3dVector *)&V[(long)local_254 + -1].z,
                         (ON_3dVector *)&V[(long)local_258 + -1].z);
          ::operator*(&local_270,d,(ON_3dVector *)&V[(long)local_258 + -1].z);
          ON_3dVector::operator-=((ON_3dVector *)&V[(long)local_254 + -1].z,&local_270);
        }
        T.z._7_1_ = ON_3dVector::Unitize((ON_3dVector *)&V[(long)local_254 + -1].z);
      }
      if (T.z._7_1_ != false) {
        this->m_xform[0][0] = local_208;
        this->m_xform[0][1] = V[0].x;
        this->m_xform[0][2] = V[0].y;
        this->m_xform[1][0] = V[0].z;
        this->m_xform[1][1] = V[1].x;
        this->m_xform[1][2] = V[1].y;
        this->m_xform[2][0] = V[1].z;
        this->m_xform[2][1] = V[2].x;
        this->m_xform[2][2] = V[2].y;
      }
    }
  }
  return T.z._7_1_;
}

Assistant:

bool ON_Xform::Orthogonalize(double tol)
{
	bool rc = false;
	if (IsAffine())
	{
		ON_3dVector T;
		ON_Xform L;
		DecomposeAffine(T, L);
		ON_Xform LTL = L;
		LTL.Transpose();
		LTL = LTL * L;
		if (!LTL.IsIdentity(tol))
		{
			// Gram - Schmidt
			ON_3dVector V[3];
			V[0] = ON_3dVector(m_xform[0]);
			V[1] = ON_3dVector(m_xform[1]);
			V[2] = ON_3dVector(m_xform[2]);
			rc = true;
			for (int i = 0; rc && i < 3; i++)
			{
				for (int j = 0; j < i; j++)
					V[i] -= V[i] * V[j] * V[j];
				rc = V[i].Unitize();
			}
			if (rc)
			{
				*(reinterpret_cast<ON_3dVector*>(m_xform[0])) = V[0];
				*(reinterpret_cast<ON_3dVector*>(m_xform[1])) = V[1];
				*(reinterpret_cast<ON_3dVector*>(m_xform[2])) = V[2];
			}
		}
		else
			rc = true;
	}
	return rc;
}